

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbe_c.hpp
# Opt level: O0

void ExchCXX::kernel_traits<ExchCXX::BuiltinPBE_C>::eval_exc_vxc_unpolar_impl
               (double rho,double sigma,double *eps,double *vrho,double *vsigma)

{
  double *in_RDX;
  double *in_RSI;
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double in_XMM1_Qa;
  double t240;
  double t238;
  double t237;
  double t236;
  double t235;
  double t232;
  double t231;
  double t228;
  double t220;
  double t217;
  double t215;
  double t214;
  double t212;
  double t211;
  double t206;
  double t204;
  double t202;
  double t201;
  double t200;
  double t198;
  double t197;
  double t194;
  double t193;
  double t192;
  double t191;
  double t189;
  double t186;
  double t185;
  double t184;
  double t183;
  double t181;
  double t180;
  double t179;
  double t177;
  double t176;
  double t175;
  double t174;
  double t173;
  double t165;
  double t163;
  double t162;
  double t161;
  double t160;
  double t159;
  double t157;
  double t152;
  double t151;
  double t150;
  double t149;
  double t148;
  double t145;
  double t144;
  double t143;
  double t142;
  double t141;
  double t140;
  double t138;
  double t133;
  double t132;
  double t131;
  double t129;
  double t127;
  double t126;
  double t124;
  double t122;
  double t121;
  double t120;
  double t119;
  double t118;
  double t116;
  double t115;
  double t113;
  double t112;
  double t111;
  double t109;
  double t108;
  double t107;
  double t103;
  double t102;
  double t99;
  double t95;
  double t94;
  double t93;
  double t92;
  double t90;
  double t88;
  double t87;
  double t85;
  double t84;
  double t83;
  double t82;
  double t81;
  double t79;
  double t72;
  double t68;
  double t65;
  double t63;
  double t62;
  double t61;
  double t60;
  double t59;
  double t58;
  double t57;
  double t54;
  double t53;
  double t50;
  double t45;
  double t43;
  double t36;
  double t34;
  double t33;
  double t32;
  double t30;
  double t29;
  double t26;
  double t24;
  double t21;
  double t16;
  double t13;
  double t12;
  double t10;
  double t7;
  double t234;
  double t224;
  double t182;
  double t172;
  double t171;
  double t170;
  double t125;
  double t104;
  double t98;
  double t97;
  double t96;
  double t91;
  double t76;
  double t75;
  double t70;
  double t20;
  double t19;
  double t18;
  double t6;
  double t4;
  double t39;
  double t5;
  double t3;
  double t1;
  double in_stack_fffffffffffffb50;
  
  dVar1 = safe_math::cbrt<double>(9.23724400024982e-318);
  dVar2 = 2.4814019635975995 / dVar1;
  dVar3 = dVar2 * 0.053425 + 1.0;
  dVar4 = safe_math::sqrt<double>(9.23769359998754e-318);
  dVar5 = pow_3_2<double>(in_stack_fffffffffffffb50);
  dVar6 = dVar1 * dVar1;
  dVar7 = (1.5393389262365056 / dVar6) * 0.123235 +
          dVar5 * 0.204775 + dVar4 * 3.79785 + dVar2 * 0.8969;
  dVar8 = safe_math::log<double>(9.23886947622464e-318);
  dVar9 = dVar3 * 0.0621814 * dVar8;
  dVar10 = safe_math::cbrt<double>(9.23921038152027e-318);
  dVar11 = piecewise_functor_3<double>(false,dVar10 * 1e-15,1.0);
  dVar11 = (dVar11 + dVar11 + -2.0) / 0.5198420997897464;
  dVar12 = dVar2 * 0.0278125 + 1.0;
  dVar2 = (1.5393389262365056 / dVar6) * 0.1241775 +
          dVar5 * 0.1100325 + dVar4 * 5.1785 + dVar2 * 0.905775;
  dVar5 = safe_math::log<double>(9.24064811254967e-318);
  dVar13 = dVar11 * 0.0197516734986138 * dVar12 * dVar5;
  dVar14 = piecewise_functor_3<double>(false,dVar10 * dVar10,1.0);
  dVar10 = dVar14 * dVar14;
  dVar14 = dVar10 * dVar14;
  dVar15 = in_XMM0_Qa * in_XMM0_Qa;
  dVar16 = (1.0 / dVar1) / dVar15;
  dVar17 = (1.0 / dVar10) * 2.080083823051904 * 1.4645918875615236 * 1.5874010519681996;
  dVar18 = safe_math::exp<double>(9.24285658598658e-318);
  dVar19 = dVar18 - 1.0;
  dVar20 = 1.0 / dVar19;
  dVar21 = dVar20 * 32.16396844291482 * 0.06672455060314922 * in_XMM1_Qa * in_XMM1_Qa;
  dVar22 = (1.0 / dVar6) / (dVar15 * dVar15);
  dVar23 = 1.0 / (dVar10 * dVar10);
  dVar24 = dVar22 * 1.5874010519681996 * dVar23 * 7.795554179441513;
  dVar25 = (in_XMM1_Qa * dVar16 * 1.2599210498948732 * dVar17) / 96.0 + (dVar21 * dVar24) / 3072.0;
  dVar26 = dVar20 * 2.1461263399673647 * dVar25 + 1.0;
  dVar27 = (1.0 / dVar26) * 32.16396844291482;
  dVar28 = safe_math::log<double>(9.245954377586e-318);
  dVar28 = dVar14 * 0.031090690869654894 * dVar28;
  dVar29 = (1.0 / dVar1) / in_XMM0_Qa;
  dVar8 = dVar29 * 2.519842099789747 * 0.9847450218426962 * dVar8 * 0.0011073470983333333;
  dVar4 = (1.0 / dVar4) * 1.4422495703074083 * dVar29 * 1.720508027656199;
  dVar30 = dVar29 * 2.519842099789747 * 0.9847450218426962;
  dVar31 = safe_math::sqrt<double>(9.24777747981916e-318);
  dVar31 = dVar31 * 1.4422495703074083 * dVar29 * 1.720508027656199;
  dVar32 = (1.5393389262365056 / dVar6) / in_XMM0_Qa;
  dVar3 = dVar3 * (1.0 / (dVar7 * dVar7)) *
          (dVar32 * -0.08215666666666667 +
          dVar31 * -0.1023875 + dVar4 * -0.632975 + -(dVar30 * 0.29896666666666666)) *
          (1.0 / (16.081979498692537 / dVar7 + 1.0)) * 1.0;
  dVar5 = dVar11 * 1.4422495703074083 * 1.720508027656199 * dVar29 * dVar5 * 0.00018311447306006544;
  dVar2 = dVar11 * dVar12 *
          (1.0 / (dVar2 * dVar2)) *
          (dVar32 * -0.082785 +
          dVar31 * -0.05501625 + dVar4 * -0.8630833333333333 + -(dVar30 * 0.301925)) *
          (1.0 / (29.608749977793437 / dVar2 + 1.0)) * 0.5848223622634646;
  dVar4 = 1.0 / (dVar19 * dVar19);
  dVar7 = ((dVar8 + dVar3) - dVar5) - dVar2;
  dVar1 = -(dVar21 * 0.0015190972222222222) *
          ((1.0 / dVar6) / (dVar15 * dVar15 * in_XMM0_Qa)) * 1.5874010519681996 * dVar23 *
          7.795554179441513 +
          in_XMM1_Qa * -0.024305555555555556 * ((1.0 / dVar1) / (dVar15 * in_XMM0_Qa)) *
          1.2599210498948732 * dVar17 +
          (dVar4 * in_XMM1_Qa * in_XMM1_Qa * dVar22 * 69.0279398732186 *
          ((1.0 / (dVar10 * dVar10)) / dVar14) * 1.5874010519681996 * 1.4422495703074083 *
          dVar7 * dVar18 * 5.405135380126985) / 3072.0;
  dVar6 = 1.0 / (dVar26 * dVar26);
  dVar11 = 1.0 / (dVar25 * 0.06672455060314922 * dVar27 + 1.0);
  dVar10 = (dVar16 * 1.2599210498948732 * (1.0 / dVar10) * 4.83597586204941) / 96.0 +
           (dVar20 * 32.16396844291482 * 0.06672455060314922 * in_XMM1_Qa * dVar24) / 1536.0;
  *in_RDI = -dVar9 + dVar13 + dVar28;
  *in_RSI = in_XMM0_Qa *
            ((((dVar8 + dVar3) - dVar5) - dVar2) +
            dVar14 * 0.031090690869654894 *
            (-(dVar25 * 0.06672455060314922) *
             dVar6 * 32.16396844291482 *
             (dVar4 * 69.0279398732186 * dVar25 * dVar7 * (1.0 / dVar14) * dVar18 +
             dVar20 * 2.1461263399673647 * dVar1) + dVar1 * 0.06672455060314922 * dVar27) * dVar11)
            + -dVar9 + dVar13 + dVar28;
  *in_RDX = in_XMM0_Qa * 0.031090690869654894 * dVar14 *
            (dVar10 * 0.06672455060314922 * dVar27 +
            -(dVar25 * 0.004452165653192221 * 1034.5208659968205 * dVar6 * dVar20 * dVar10)) *
            dVar11;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_vxc_unpolar_impl( double rho, double sigma, double& eps, double& vrho, double& vsigma ) {

    (void)(eps);
    constexpr double t1 = constants::m_cbrt_3;
    constexpr double t3 = constants::m_cbrt_one_ov_pi;
    constexpr double t5 = constants::m_cbrt_4;
    constexpr double t39 = constants::m_cbrt_2;
    constexpr double t4 = t1 * t3;
    constexpr double t6 = t5 * t5;
    constexpr double t18 = t1 * t1;
    constexpr double t19 = t3 * t3;
    constexpr double t20 = t18 * t19;
    constexpr double t70 = 0.1e1 / t3;
    constexpr double t75 = BB * beta;
    constexpr double t76 = 0.1e1 / gamma;
    constexpr double t91 = t39 * t39;
    constexpr double t96 = 0.1e1 / t19;
    constexpr double t97 = t1 * t96;
    constexpr double t98 = t97 * t6;
    constexpr double t104 = beta * t76;
    constexpr double t125 = t3 * t6;
    constexpr double t170 = gamma * gamma;
    constexpr double t171 = 0.1e1 / t170;
    constexpr double t172 = t75 * t171;
    constexpr double t182 = t96 * t6;
    constexpr double t224 = t18 * t70 * t5;
    constexpr double t234 = beta * beta;


    const double t7 = safe_math::cbrt( rho );
    const double t10 = t4 * t6 / t7;
    const double t12 = 0.1e1 + 0.53425e-1 * t10;
    const double t13 = safe_math::sqrt( t10 );
    const double t16 = pow_3_2( t10 );
    const double t21 = t7 * t7;
    const double t24 = t20 * t5 / t21;
    const double t26 = 0.379785e1 * t13 + 0.8969e0 * t10 + 0.204775e0 * t16 + 0.123235e0 * t24;
    const double t29 = 0.1e1 + 0.16081979498692535067e2 / t26;
    const double t30 = safe_math::log( t29 );
    const double t32 = 0.621814e-1 * t12 * t30;
    const double t33 = 0.1e1 <= zeta_tol;
    const double t34 = safe_math::cbrt( zeta_tol );
    const double t36 = piecewise_functor_3( t33, t34 * zeta_tol, 1.0 );
    const double t43 = ( 0.2e1 * t36 - 0.2e1 ) / ( 0.2e1 * t39 - 0.2e1 );
    const double t45 = 0.1e1 + 0.278125e-1 * t10;
    const double t50 = 0.51785e1 * t13 + 0.905775e0 * t10 + 0.1100325e0 * t16 + 0.1241775e0 * t24;
    const double t53 = 0.1e1 + 0.29608749977793437516e2 / t50;
    const double t54 = safe_math::log( t53 );
    const double t57 = 0.19751673498613801407e-1 * t43 * t45 * t54;
    const double t58 = t34 * t34;
    const double t59 = piecewise_functor_3( t33, t58, 1.0 );
    const double t60 = t59 * t59;
    const double t61 = t60 * t59;
    const double t62 = gamma * t61;
    const double t63 = rho * rho;
    const double t65 = 0.1e1 / t7 / t63;
    const double t68 = 0.1e1 / t60;
    const double t72 = t68 * t18 * t70 * t5;
    const double t79 = 0.1e1 / t61;
    const double t81 = safe_math::exp( -( -t32 + t57 ) * t76 * t79 );
    const double t82 = t81 - 0.1e1;
    const double t83 = 0.1e1 / t82;
    const double t84 = t76 * t83;
    const double t85 = sigma * sigma;
    const double t87 = t75 * t84 * t85;
    const double t88 = t63 * t63;
    const double t90 = 0.1e1 / t21 / t88;
    const double t92 = t90 * t91;
    const double t93 = t60 * t60;
    const double t94 = 0.1e1 / t93;
    const double t95 = t92 * t94;
    const double t99 = t95 * t98;
    const double t102 = sigma * t65 * t39 * t72 / 0.96e2 + t87 * t99 / 0.3072e4;
    const double t103 = beta * t102;
    const double t107 = t104 * t83 * t102 + 0.1e1;
    const double t108 = 0.1e1 / t107;
    const double t109 = t76 * t108;
    const double t111 = t103 * t109 + 0.1e1;
    const double t112 = safe_math::log( t111 );
    const double t113 = t62 * t112;
    const double t115 = 0.1e1 / t7 / rho;
    const double t116 = t6 * t115;
    const double t118 = t4 * t116 * t30;
    const double t119 = 0.11073470983333333333e-2 * t118;
    const double t120 = t26 * t26;
    const double t121 = 0.1e1 / t120;
    const double t122 = t12 * t121;
    const double t124 = 0.1e1 / t13 * t1;
    const double t126 = t125 * t115;
    const double t127 = t124 * t126;
    const double t129 = t4 * t116;
    const double t131 = safe_math::sqrt( t10 );
    const double t132 = t131 * t1;
    const double t133 = t132 * t126;
    const double t138 = t20 * t5 / t21 / rho;
    const double t140 = -0.632975e0 * t127 - 0.29896666666666666667e0 * t129 - 0.1023875e0 * t133 - 0.82156666666666666667e-1 * t138;
    const double t141 = 0.1e1 / t29;
    const double t142 = t140 * t141;
    const double t143 = t122 * t142;
    const double t144 = 0.1e1 * t143;
    const double t145 = t43 * t1;
    const double t148 = t145 * t125 * t115 * t54;
    const double t149 = 0.18311447306006545054e-3 * t148;
    const double t150 = t43 * t45;
    const double t151 = t50 * t50;
    const double t152 = 0.1e1 / t151;
    const double t157 = -0.86308333333333333334e0 * t127 - 0.301925e0 * t129 - 0.5501625e-1 * t133 - 0.82785e-1 * t138;
    const double t159 = 0.1e1 / t53;
    const double t160 = t152 * t157 * t159;
    const double t161 = t150 * t160;
    const double t162 = 0.5848223622634646207e0 * t161;
    const double t163 = t63 * rho;
    const double t165 = 0.1e1 / t7 / t163;
    const double t173 = t82 * t82;
    const double t174 = 0.1e1 / t173;
    const double t175 = t174 * t85;
    const double t176 = t175 * t90;
    const double t177 = t172 * t176;
    const double t179 = 0.1e1 / t93 / t61;
    const double t180 = t91 * t179;
    const double t181 = t180 * t1;
    const double t183 = t119 + t144 - t149 - t162;
    const double t184 = t183 * t81;
    const double t185 = t182 * t184;
    const double t186 = t181 * t185;
    const double t189 = t88 * rho;
    const double t191 = 0.1e1 / t21 / t189;
    const double t192 = t191 * t91;
    const double t193 = t192 * t94;
    const double t194 = t193 * t98;
    const double t197 = -0.7e1 / 0.288e3 * sigma * t165 * t39 * t72 + t177 * t186 / 0.3072e4 - 0.7e1 / 0.4608e4 * t87 * t194;
    const double t198 = beta * t197;
    const double t200 = t107 * t107;
    const double t201 = 0.1e1 / t200;
    const double t202 = t76 * t201;
    const double t204 = beta * t171 * t174;
    const double t206 = t79 * t81;
    const double t211 = t204 * t102 * t183 * t206 + t104 * t83 * t197;
    const double t212 = t202 * t211;
    const double t214 = -t103 * t212 + t198 * t109;
    const double t215 = 0.1e1 / t111;
    const double t217 = t62 * t214 * t215;
    const double t220 = rho * gamma;
    const double t228 = t75 * t84 * sigma;
    const double t231 = t65 * t39 * t68 * t224 / 0.96e2 + t228 * t99 / 0.1536e4;
    const double t232 = beta * t231;
    const double t235 = t234 * t102;
    const double t236 = t235 * t171;
    const double t237 = t201 * t83;
    const double t238 = t237 * t231;
    const double t240 = t232 * t109 - t236 * t238;


    eps = -t32 + t57 + t113;
    vrho = -t32 + t57 + t113 + rho * ( t119 + t144 - t149 - t162 + t217 );
    vsigma = t220 * t61 * t240 * t215;

  }